

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O1

int siftBackwardProb(DdManager *table,Move *moves,int size,double temp)

{
  Move **ppMVar1;
  int iVar2;
  Move *pMVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  
  pMVar3 = moves;
  iVar5 = size;
  if (moves != (Move *)0x0) {
    do {
      if (pMVar3->size < iVar5) {
        iVar5 = pMVar3->size;
      }
      ppMVar1 = &pMVar3->next;
      pMVar3 = *ppMVar1;
    } while (*ppMVar1 != (Move *)0x0);
  }
  if (iVar5 == size) {
    lVar4 = Cudd_Random();
    dVar6 = exp((double)((ulong)(double)(table->keys - (size + table->isolated)) |
                        (ulong)DAT_0097de30) / temp);
    if ((double)lVar4 / 2147483561.0 < dVar6) {
      return 1;
    }
  }
  if (moves != (Move *)0x0) {
    iVar2 = table->keys - table->isolated;
    do {
      if (iVar2 == iVar5) {
        return 1;
      }
      iVar2 = cuddSwapInPlace(table,moves->x,moves->y);
      if (iVar2 == 0) {
        return 0;
      }
      moves = moves->next;
    } while (moves != (Move *)0x0);
  }
  return 1;
}

Assistant:

static int
siftBackwardProb(
  DdManager * table,
  Move * moves,
  int  size,
  double  temp)
{
    Move   *move;
    int    res;
    int    best_size = size;
    double coin, threshold;

    /* Look for best size during the last sifting */
    for (move = moves; move != NULL; move = move->next) {
        if (move->size < best_size) {
            best_size = move->size;
        }
    }
    
    /* If best_size equals size, the last sifting did not produce any
    ** improvement. We now toss a coin to decide whether to retain
    ** this change or not.
    */
    if (best_size == size) {
        coin = random_generator();
#ifdef DD_STATS
        tosses++;
#endif
        threshold = exp(-((double)(table->keys - table->isolated - size))/temp);
        if (coin < threshold) {
#ifdef DD_STATS
            acceptances++;
#endif
            return(1);
        }
    }

    /* Either there was improvement, or we have decided not to
    ** accept the uphill move. Go to best position.
    */
    res = table->keys - table->isolated;
    for (move = moves; move != NULL; move = move->next) {
        if (res == best_size) return(1);
        res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
        if (!res) return(0);
    }

    return(1);

}